

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_model *
rf_load_model_from_obj
          (rf_model *__return_storage_ptr__,char *filename,rf_allocator allocator,
          rf_allocator temp_allocator,rf_io_callbacks io)

{
  size_t sVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined8 uVar8;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  int iVar15;
  uint uVar16;
  undefined4 uVar17;
  float *pfVar18;
  long lVar19;
  short sVar20;
  undefined8 uVar21;
  rf_source_location rVar22;
  rf_source_location rVar23;
  rf_source_location rVar24;
  rf_source_location rVar25;
  rf_source_location rVar26;
  rf_source_location rVar27;
  rf_source_location rVar28;
  rf_source_location rVar29;
  rf_source_location rVar30;
  rf_source_location rVar31;
  rf_source_location rVar32;
  rf_source_location rVar33;
  rf_source_location rVar34;
  rf_source_location rVar35;
  rf_source_location rVar36;
  rf_source_location rVar37;
  rf_source_location rVar38;
  rf_source_location rVar39;
  rf_source_location rVar40;
  rf_source_location rVar41;
  rf_source_location rVar42;
  rf_source_location rVar43;
  rf_source_location rVar44;
  rf_source_location rVar45;
  rf_source_location rVar46;
  rf_source_location rVar47;
  rf_source_location rVar48;
  rf_source_location rVar49;
  rf_source_location rVar50;
  rf_source_location rVar51;
  rf_source_location rVar52;
  rf_source_location rVar53;
  rf_source_location rVar54;
  rf_source_location rVar55;
  rf_source_location rVar56;
  rf_allocator_args rVar57;
  rf_allocator_args rVar58;
  rf_allocator_args rVar59;
  rf_allocator_args rVar60;
  rf_allocator_args rVar61;
  rf_allocator_args rVar62;
  rf_allocator_args rVar63;
  rf_allocator_args rVar64;
  rf_allocator_args rVar65;
  rf_allocator_args rVar66;
  rf_allocator_args rVar67;
  rf_allocator_args rVar68;
  rf_allocator_args rVar69;
  rf_allocator allocator_00;
  rf_allocator allocator_01;
  rf_source_location rVar70;
  rf_source_location rVar71;
  rf_source_location rVar72;
  rf_source_location rVar73;
  rf_source_location rVar74;
  rf_source_location rVar75;
  rf_allocator_args rVar76;
  rf_allocator_args rVar77;
  rf_allocator_args rVar78;
  rf_allocator_args rVar79;
  rf_allocator_args rVar80;
  rf_allocator_args rVar81;
  undefined1 auVar82 [24];
  undefined1 auVar83 [24];
  undefined1 auVar84 [24];
  undefined1 auVar85 [24];
  undefined1 auVar86 [24];
  undefined1 auVar87 [24];
  undefined1 auVar88 [24];
  undefined1 auVar89 [24];
  undefined1 auVar90 [24];
  undefined1 auVar91 [24];
  undefined1 auVar92 [24];
  undefined1 auVar93 [24];
  undefined1 auVar94 [24];
  undefined1 auVar95 [24];
  undefined1 auVar96 [24];
  undefined1 auVar97 [24];
  undefined1 auVar98 [24];
  undefined1 auVar99 [24];
  undefined1 auVar100 [24];
  undefined1 auVar101 [24];
  undefined1 auVar102 [24];
  undefined1 auVar103 [24];
  char cVar104;
  rf_allocator_proc *prVar105;
  undefined8 *puVar106;
  undefined4 *puVar107;
  undefined8 uVar108;
  void *__dest;
  rf_mesh *prVar109;
  float *pfVar110;
  int *piVar111;
  unsigned_short *puVar112;
  uint *puVar113;
  size_t sVar114;
  void *pvVar115;
  ulong uVar116;
  void *__dest_00;
  void *__dest_01;
  rf_allocator_proc *prVar117;
  void *__dest_02;
  void *__dest_03;
  void *__dest_04;
  rf_bone_info *prVar118;
  rf_transform *prVar119;
  rf_mesh *prVar120;
  rf_material *__s;
  uint uVar121;
  long lVar122;
  ulong uVar123;
  undefined4 *puVar124;
  void *extraout_RDX;
  ulong uVar125;
  ulong uVar126;
  ulong uVar127;
  char *msg;
  rf_model *prVar128;
  char *pcVar129;
  rf_mesh *prVar130;
  rf_allocator_proc *prVar131;
  long lVar132;
  rf_allocator_proc *prVar133;
  long in_FS_OFFSET;
  byte bVar134;
  undefined1 auVar135 [16];
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  rf_quaternion q;
  rf_vec3 rVar140;
  rf_allocator temp_allocator_00;
  rf_allocator rStack_a38;
  size_t sStack_a28;
  rf_mesh *prStack_a20;
  ulong uStack_a18;
  rf_bone_info *prStack_a10;
  size_t sStack_a08;
  long lStack_a00;
  void *pvStack_9f8;
  rf_model *prStack_9f0;
  rf_allocator rStack_9e8;
  void *pvStack_9d8;
  undefined8 uStack_9d0;
  undefined4 uStack_9c8;
  uint uStack_9c4;
  char *pcStack_9c0;
  char *pcStack_9b8;
  undefined8 uStack_9b0;
  void *pvStack_9a8;
  undefined8 uStack_9a0;
  undefined4 uStack_998;
  uint uStack_994;
  char *pcStack_990;
  char *pcStack_988;
  undefined8 uStack_980;
  void *pvStack_978;
  undefined8 uStack_970;
  undefined4 uStack_968;
  uint uStack_964;
  char *pcStack_960;
  char *pcStack_958;
  undefined8 uStack_950;
  rf_allocator_proc *prStack_948;
  undefined8 uStack_940;
  undefined4 uStack_938;
  uint uStack_934;
  char *pcStack_930;
  char *pcStack_928;
  undefined8 uStack_920;
  void *pvStack_918;
  undefined8 uStack_910;
  undefined4 uStack_908;
  uint uStack_904;
  char *pcStack_900;
  char *pcStack_8f8;
  undefined8 uStack_8f0;
  void *pvStack_8e8;
  undefined8 uStack_8e0;
  undefined4 uStack_8d8;
  uint uStack_8d4;
  char *pcStack_8d0;
  char *pcStack_8c8;
  undefined8 uStack_8c0;
  void *pvStack_8b8;
  undefined8 uStack_8b0;
  undefined4 uStack_8a8;
  uint uStack_8a4;
  char *pcStack_8a0;
  char *pcStack_898;
  undefined8 uStack_890;
  void *pvStack_888;
  undefined8 uStack_880;
  undefined4 uStack_878;
  uint uStack_874;
  char *pcStack_870;
  char *pcStack_868;
  undefined8 uStack_860;
  void *pvStack_858;
  undefined8 uStack_850;
  undefined4 uStack_848;
  uint uStack_844;
  char *pcStack_840;
  char *pcStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  long lStack_820;
  undefined4 uStack_818;
  uint uStack_814;
  char *pcStack_810;
  char *pcStack_808;
  undefined8 uStack_800;
  undefined8 uStack_7f8;
  long lStack_7f0;
  undefined4 uStack_7e8;
  uint uStack_7e4;
  char *pcStack_7e0;
  char *pcStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  size_t sStack_7c0;
  undefined4 uStack_7b8;
  uint uStack_7b4;
  char *pcStack_7b0;
  char *pcStack_7a8;
  undefined8 uStack_7a0;
  undefined8 uStack_798;
  ulong uStack_790;
  undefined4 uStack_788;
  uint uStack_784;
  char *pcStack_780;
  char *pcStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  ulong uStack_760;
  undefined4 uStack_758;
  uint uStack_754;
  char *pcStack_750;
  char *pcStack_748;
  undefined8 uStack_740;
  undefined8 uStack_738;
  size_t sStack_730;
  undefined4 uStack_728;
  uint uStack_724;
  char *pcStack_720;
  char *pcStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  size_t sStack_700;
  undefined4 uStack_6f8;
  uint uStack_6f4;
  char *pcStack_6f0;
  char *pcStack_6e8;
  undefined8 uStack_6e0;
  undefined8 uStack_6d8;
  size_t sStack_6d0;
  undefined4 uStack_6c8;
  uint uStack_6c4;
  char *pcStack_6c0;
  char *pcStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  size_t sStack_6a0;
  undefined4 uStack_698;
  uint uStack_694;
  char *pcStack_690;
  char *pcStack_688;
  undefined8 uStack_680;
  undefined8 uStack_678;
  size_t sStack_670;
  undefined4 uStack_668;
  uint uStack_664;
  char *pcStack_660;
  char *pcStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 uStack_640;
  undefined4 uStack_638;
  uint uStack_634;
  char *pcStack_630;
  char *pcStack_628;
  undefined8 uStack_620;
  undefined8 uStack_618;
  long lStack_610;
  undefined4 uStack_608;
  uint uStack_604;
  char *pcStack_600;
  char *pcStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  long lStack_5e0;
  undefined4 uStack_5d8;
  uint uStack_5d4;
  char *pcStack_5d0;
  char *pcStack_5c8;
  undefined8 uStack_5c0;
  undefined8 uStack_5b8;
  long lStack_5b0;
  undefined4 uStack_5a8;
  uint uStack_5a4;
  char *pcStack_5a0;
  char *pcStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  long lStack_580;
  undefined4 uStack_578;
  uint uStack_574;
  char *pcStack_570;
  char *pcStack_568;
  undefined8 uStack_560;
  undefined8 uStack_558;
  long lStack_550;
  undefined4 uStack_548;
  uint uStack_544;
  char *pcStack_540;
  char *pcStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  long lStack_520;
  undefined4 uStack_518;
  uint uStack_514;
  char *pcStack_510;
  char *pcStack_508;
  undefined8 uStack_500;
  undefined8 uStack_4f8;
  long lStack_4f0;
  undefined4 uStack_4e8;
  uint uStack_4e4;
  char *pcStack_4e0;
  char *pcStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  long lStack_4c0;
  undefined4 uStack_4b8;
  uint uStack_4b4;
  char *pcStack_4b0;
  char *pcStack_4a8;
  undefined8 uStack_4a0;
  undefined8 uStack_498;
  long lStack_490;
  undefined4 uStack_488;
  uint uStack_484;
  char *pcStack_480;
  char *pcStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  size_t sStack_460;
  undefined4 uStack_458;
  uint uStack_454;
  char *pcStack_450;
  char *pcStack_448;
  undefined8 uStack_440;
  undefined4 *puStack_438;
  undefined8 uStack_430;
  undefined4 uStack_428;
  uint uStack_424;
  char *pcStack_420;
  char *pcStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 uStack_400;
  undefined4 uStack_3f8;
  uint uStack_3f4;
  char *pcStack_3f0;
  char *pcStack_3e8;
  undefined8 uStack_3e0;
  undefined8 uStack_3d8;
  size_t sStack_3d0;
  undefined4 uStack_3c8;
  uint uStack_3c4;
  undefined8 uStack_3c0;
  undefined8 uStack_3b8;
  undefined4 uStack_3b0;
  uint uStack_3ac;
  char *pcStack_3a8;
  char *pcStack_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined4 uStack_380;
  uint uStack_37c;
  char *pcStack_378;
  char *pcStack_370;
  undefined8 uStack_368;
  char *pcStack_360;
  char *pcStack_358;
  undefined8 uStack_350;
  char *pcStack_348;
  char *pcStack_340;
  undefined8 uStack_338;
  char *pcStack_330;
  char *pcStack_328;
  undefined8 uStack_320;
  char *pcStack_318;
  char *pcStack_310;
  undefined8 uStack_308;
  char cStack_2fc;
  char cStack_2fb;
  char cStack_2fa;
  char cStack_2f9;
  char cStack_2f8;
  char cStack_2f7;
  char cStack_2f6;
  char cStack_2f5;
  char cStack_2f4;
  char cStack_2f3;
  char cStack_2f2;
  char cStack_2f1;
  char cStack_2f0;
  char cStack_2ef;
  char cStack_2ee;
  char cStack_2ed;
  int iStack_2ec;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  int iStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  uint uStack_2c0;
  uint uStack_2b8;
  uint uStack_2b4;
  rf_mesh rStack_280;
  rf_model *prStack_1e8;
  undefined8 uStack_1e0;
  code *pcVar141;
  code *pcVar142;
  uint uStack_16c;
  uint uStack_f4;
  uint uStack_c4;
  void *local_a8;
  rf_allocator_proc *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  float local_88;
  float fStack_84;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_68;
  uint uStack_64;
  rf_int local_58;
  rf_material *prStack_50;
  undefined4 local_48;
  uint uStack_44;
  char *local_38;
  char *pcStack_30;
  undefined8 local_28;
  
  prVar133 = temp_allocator.allocator_proc;
  prVar131 = (rf_allocator_proc *)temp_allocator.user_data;
  prVar117 = allocator.allocator_proc;
  local_a8 = allocator.user_data;
  bVar134 = 0;
  *(rf_allocator_proc **)(in_FS_OFFSET + -0x430) = prVar131;
  *(rf_allocator_proc **)(in_FS_OFFSET + -0x428) = prVar133;
  *(void **)(in_FS_OFFSET + -0x420) = io.user_data;
  *(_func_rf_int_void_ptr_char_ptr **)(in_FS_OFFSET + -0x418) = io.file_size_proc;
  *(_func__Bool_void_ptr_char_ptr_void_ptr_rf_int **)(in_FS_OFFSET + -0x410) = io.read_file_proc;
  local_a0 = prVar117;
  if ((filename != (char *)0x0) &&
     (prVar105 = (rf_allocator_proc *)
                 (**(code **)(in_FS_OFFSET + -0x418))
                           (*(undefined8 *)(in_FS_OFFSET + -0x420),filename),
     prVar105 != (rf_allocator_proc *)0x0)) {
    (**(code **)(in_FS_OFFSET + -0x410))(*(undefined8 *)(in_FS_OFFSET + -0x420),filename,0);
    prVar117 = prVar105;
  }
  local_38 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_30 = "rf_load_model_from_obj";
  local_28 = 0x8259;
  rf_log_impl(4,0x17d79a,filename);
  rVar70.proc_name = "rf_load_model_from_obj";
  rVar70.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar70.line_in_file = 0x8265;
  rVar76._16_8_ = (ulong)uStack_c4 << 0x20;
  rVar76.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x70) << 0x40,0);
  rVar76.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x70) << 0x40,8);
  puVar106 = (undefined8 *)(*local_a0)((rf_allocator *)&local_a8,rVar70,RF_AM_ALLOC,rVar76);
  *puVar106 = 0;
  puVar106[1] = 0;
  puVar106[2] = 0;
  puVar106[3] = 0;
  puVar106[4] = 0;
  puVar106[5] = 0;
  puVar106[6] = 0;
  puVar106[7] = 0;
  puVar106[8] = 0;
  puVar106[9] = 0;
  puVar106[10] = 0;
  puVar106[0xb] = 0;
  puVar106[0xc] = 0;
  puVar106[0xd] = 0;
  rVar71.proc_name = "rf_load_model_from_obj";
  rVar71.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar71.line_in_file = 0x8271;
  rVar77._16_8_ = (ulong)uStack_f4 << 0x20;
  rVar77.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(4) << 0x40,0);
  rVar77.size_to_allocate_or_reallocate = SUB168(ZEXT816(4) << 0x40,8);
  puVar107 = (undefined4 *)(*local_a0)((rf_allocator *)&local_a8,rVar71,RF_AM_ALLOC,rVar77);
  *puVar107 = 0;
  local_48 = 0;
  local_58 = 0;
  prStack_50 = (rf_material *)0x0;
  rVar72.proc_name = "rf_load_model_from_obj";
  rVar72.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar72.line_in_file = 0x827c;
  rVar78._16_8_ = (ulong)uStack_44 << 0x20;
  rVar78.pointer_to_free_or_realloc = (void *)0x0;
  rVar78.size_to_allocate_or_reallocate = 0;
  (*local_a0)((rf_allocator *)&local_a8,rVar72,RF_AM_ALLOC,rVar78);
  local_78._0_4_ = 0.0;
  local_78._4_4_ = 0.0;
  uStack_70._0_4_ = 0.0;
  uStack_70._4_4_ = 0.0;
  local_68 = 0;
  rVar73.proc_name = "rf_load_model_from_obj";
  rVar73.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar73.line_in_file = 0x827d;
  rVar79._16_8_ = (ulong)uStack_64 << 0x20;
  rVar79.pointer_to_free_or_realloc = (void *)0x0;
  rVar79.size_to_allocate_or_reallocate = 0;
  (*local_a0)((rf_allocator *)&local_a8,rVar73,RF_AM_ALLOC,rVar79);
  local_98._0_4_ = 0.0;
  local_98._4_4_ = 0.0;
  uStack_90._0_4_ = 0.0;
  uStack_90._4_4_ = 0.0;
  local_88 = 0.0;
  rVar74.proc_name = "rf_load_model_from_obj";
  rVar74.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar74.line_in_file = 0x827e;
  rVar80._16_8_ = (ulong)(uint)fStack_84 << 0x20;
  rVar80.pointer_to_free_or_realloc = (void *)0x0;
  rVar80.size_to_allocate_or_reallocate = 0;
  (*local_a0)((rf_allocator *)&local_a8,rVar74,RF_AM_ALLOC,rVar80);
  pcVar142 = (code *)0x0;
  pcVar141 = (code *)0x827f;
  pcVar129 = "rf_load_model_from_obj";
  msg = (char *)0x1;
  rVar75.proc_name = "rf_load_model_from_obj";
  rVar75.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar75.line_in_file = 0x827f;
  rVar81._16_8_ = (ulong)uStack_16c << 0x20;
  rVar81.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x1c) << 0x40,0);
  rVar81.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x1c) << 0x40,8);
  prVar128 = (rf_model *)&local_a8;
  (*local_a0)((rf_allocator *)&local_a8,rVar75,RF_AM_ALLOC,rVar81);
  uStack_1e0 = 0;
  rStack_a38.user_data = extraout_RDX;
  rStack_a38.allocator_proc = prVar117;
  prStack_1e8 = (rf_model *)&local_a8;
  uVar108 = (*pcVar141)(pcVar129);
  pcStack_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_3e8 = "rf_load_model_from_iqm";
  uStack_3e0 = 0x8355;
  uStack_408 = 0;
  uStack_3f8 = 0;
  rVar22.proc_name = "rf_load_model_from_iqm";
  rVar22.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar22.line_in_file = 0x8355;
  auVar82._8_8_ = (ulong)uStack_3f4 << 0x20;
  auVar82._0_8_ = uVar108;
  auVar82._16_8_ = 0;
  uStack_400 = uVar108;
  puVar107 = (undefined4 *)
             (*prVar133)((rf_allocator *)&stack0xfffffffffffff5b0,rVar22,RF_AM_ALLOC,
                         (rf_allocator_args)(auVar82 << 0x40));
  cVar104 = (*pcVar142)(pcVar129,msg,puVar107,uVar108);
  if (cVar104 != '\0') {
    pcStack_420 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_418 = "rf_load_model_from_iqm";
    uStack_410 = 0x8359;
    uStack_430 = 0;
    uStack_428 = 0;
    rVar23.proc_name = "rf_load_model_from_iqm";
    rVar23.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar23.line_in_file = 0x8359;
    rVar57.size_to_allocate_or_reallocate = 0;
    rVar57.pointer_to_free_or_realloc = puVar107;
    rVar57._16_8_ = (ulong)uStack_424 << 0x20;
    puStack_438 = puVar107;
    (*prVar133)((rf_allocator *)&stack0xfffffffffffff5b0,rVar23,RF_AM_FREE,rVar57);
  }
  puVar124 = puVar107;
  pcVar129 = &cStack_2fc;
  for (lVar122 = 0x1f; lVar122 != 0; lVar122 = lVar122 + -1) {
    *(undefined4 *)pcVar129 = *puVar124;
    puVar124 = puVar124 + (ulong)bVar134 * -2 + 1;
    pcVar129 = pcVar129 + ((ulong)bVar134 * -2 + 1) * 4;
  }
  auVar135[0] = -(cStack_2fc == 'I');
  auVar135[1] = -(cStack_2fb == 'N');
  auVar135[2] = -(cStack_2fa == 'T');
  auVar135[3] = -(cStack_2f9 == 'E');
  auVar135[4] = -(cStack_2f8 == 'R');
  auVar135[5] = -(cStack_2f7 == 'Q');
  auVar135[6] = -(cStack_2f6 == 'U');
  auVar135[7] = -(cStack_2f5 == 'A');
  auVar135[8] = -(cStack_2f4 == 'K');
  auVar135[9] = -(cStack_2f3 == 'E');
  auVar135[10] = -(cStack_2f2 == 'M');
  auVar135[0xb] = -(cStack_2f1 == 'O');
  auVar135[0xc] = -(cStack_2f0 == 'D');
  auVar135[0xd] = -(cStack_2ef == 'E');
  auVar135[0xe] = -(cStack_2ee == 'L');
  auVar135[0xf] = -(cStack_2ed == '\0');
  if ((ushort)((ushort)(SUB161(auVar135 >> 7,0) & 1) | (ushort)(SUB161(auVar135 >> 0xf,0) & 1) << 1
               | (ushort)(SUB161(auVar135 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar135 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar135 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar135 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar135 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar135 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar135 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar135 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar135 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar135 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar135 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar135 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar135 >> 0x77,0) & 1) << 0xe | (ushort)(auVar135[0xf] >> 7) << 0xf
              ) == 0xffff) {
    if (iStack_2ec == 2) {
      pcStack_450 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_448 = "rf_load_model_from_iqm";
      uStack_440 = 0x8376;
      uStack_468 = 0;
      uVar116 = (ulong)uStack_2d8;
      sVar1 = uVar116 * 0x18;
      uStack_458 = 0;
      rVar24.proc_name = "rf_load_model_from_iqm";
      rVar24.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar24.line_in_file = 0x8376;
      auVar83._8_8_ = (ulong)uStack_454 << 0x20;
      auVar83._0_8_ = sVar1;
      auVar83._16_8_ = 0;
      prStack_9f0 = prVar128;
      sStack_460 = sVar1;
      __dest = (*prVar133)((rf_allocator *)&stack0xfffffffffffff5b0,rVar24,RF_AM_ALLOC,
                           (rf_allocator_args)(auVar83 << 0x40));
      memcpy(__dest,(void *)((ulong)uStack_2d4 + (long)puVar107),sVar1);
      pcStack_480 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_478 = "rf_load_model_from_iqm";
      uStack_470 = 0x837a;
      uStack_498 = 0;
      lStack_a00 = uVar116 * 0x70;
      uStack_488 = 0;
      rVar25.proc_name = "rf_load_model_from_iqm";
      rVar25.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar25.line_in_file = 0x837a;
      auVar84._8_8_ = (ulong)uStack_484 << 0x20;
      auVar84._0_8_ = lStack_a00;
      auVar84._16_8_ = 0;
      lStack_490 = lStack_a00;
      prVar109 = (rf_mesh *)
                 (*rStack_a38.allocator_proc)
                           (&rStack_a38,rVar25,RF_AM_ALLOC,(rf_allocator_args)(auVar84 << 0x40));
      prStack_a20 = prVar109;
      uStack_a18 = uVar116;
      if (uVar116 != 0) {
        sVar114 = 0;
        do {
          iVar15 = *(int *)((long)__dest + sVar114 + 0xc);
          prVar109->vertex_count = iVar15;
          *(undefined8 *)&prVar109->triangle_count = 0;
          *(undefined8 *)((long)&prVar109->vertices + 4) = 0;
          *(undefined8 *)((long)&prVar109->texcoords + 4) = 0;
          *(undefined8 *)((long)&prVar109->texcoords2 + 4) = 0;
          *(undefined8 *)((long)&prVar109->normals + 4) = 0;
          *(undefined8 *)((long)&prVar109->tangents + 4) = 0;
          *(undefined8 *)((long)&prVar109->colors + 4) = 0;
          *(undefined8 *)((long)&prVar109->indices + 4) = 0;
          *(undefined8 *)((long)&prVar109->anim_vertices + 4) = 0;
          *(undefined8 *)((long)&prVar109->anim_normals + 4) = 0;
          *(undefined8 *)((long)&prVar109->bone_ids + 4) = 0;
          *(undefined8 *)((long)&prVar109->bone_weights + 4) = 0;
          *(undefined8 *)&prVar109->vao_id = 0;
          prVar109->vbo_id = (uint *)0x0;
          pcStack_4b0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          pcStack_4a8 = "rf_load_model_from_iqm";
          uStack_4a0 = 0x8385;
          uStack_4c8 = 0;
          lStack_4c0 = (long)iVar15 * 0xc;
          uStack_4b8 = 0;
          rVar26.proc_name = "rf_load_model_from_iqm";
          rVar26.file_name =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          rVar26.line_in_file = 0x8385;
          auVar85._8_8_ = (ulong)uStack_4b4 << 0x20;
          auVar85._0_8_ = lStack_4c0;
          auVar85._16_8_ = 0;
          pfVar110 = (float *)(*rStack_a38.allocator_proc)
                                        (&rStack_a38,rVar26,RF_AM_ALLOC,
                                         (rf_allocator_args)(auVar85 << 0x40));
          prVar109->vertices = pfVar110;
          memset(pfVar110,0,(long)prVar109->vertex_count * 0xc);
          pcStack_4e0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          pcStack_4d8 = "rf_load_model_from_iqm";
          uStack_4d0 = 0x8388;
          uStack_4f8 = 0;
          lStack_4f0 = (long)prVar109->vertex_count * 0xc;
          uStack_4e8 = 0;
          rVar27.proc_name = "rf_load_model_from_iqm";
          rVar27.file_name =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          rVar27.line_in_file = 0x8388;
          auVar86._8_8_ = (ulong)uStack_4e4 << 0x20;
          auVar86._0_8_ = lStack_4f0;
          auVar86._16_8_ = 0;
          pfVar110 = (float *)(*rStack_a38.allocator_proc)
                                        (&rStack_a38,rVar27,RF_AM_ALLOC,
                                         (rf_allocator_args)(auVar86 << 0x40));
          prVar109->normals = pfVar110;
          memset(pfVar110,0,(long)prVar109->vertex_count * 0xc);
          pcStack_510 = 
          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          pcStack_508 = "rf_load_model_from_iqm";
          uStack_500 = 0x838b;
          uStack_528 = 0;
          lStack_520 = (long)prVar109->vertex_count << 3;
          uStack_518 = 0;
          rVar28.proc_name = "rf_load_model_from_iqm";
          rVar28.file_name =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          rVar28.line_in_file = 0x838b;
          auVar87._8_8_ = (ulong)uStack_514 << 0x20;
          auVar87._0_8_ = lStack_520;
          auVar87._16_8_ = 0;
          pfVar110 = (float *)(*rStack_a38.allocator_proc)
                                        (&rStack_a38,rVar28,RF_AM_ALLOC,
                                         (rf_allocator_args)(auVar87 << 0x40));
          prVar109->texcoords = pfVar110;
          memset(pfVar110,0,(long)prVar109->vertex_count << 3);
          pcStack_540 = 
          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          pcStack_538 = "rf_load_model_from_iqm";
          uStack_530 = 0x838e;
          uStack_558 = 0;
          lStack_550 = (long)prVar109->vertex_count << 4;
          uStack_548 = 0;
          rVar29.proc_name = "rf_load_model_from_iqm";
          rVar29.file_name =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          rVar29.line_in_file = 0x838e;
          auVar88._8_8_ = (ulong)uStack_544 << 0x20;
          auVar88._0_8_ = lStack_550;
          auVar88._16_8_ = 0;
          piVar111 = (int *)(*rStack_a38.allocator_proc)
                                      (&rStack_a38,rVar29,RF_AM_ALLOC,
                                       (rf_allocator_args)(auVar88 << 0x40));
          prVar109->bone_ids = piVar111;
          memset(piVar111,0,(long)prVar109->vertex_count << 4);
          pcStack_570 = 
          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          pcStack_568 = "rf_load_model_from_iqm";
          uStack_560 = 0x8391;
          uStack_588 = 0;
          lStack_580 = (long)prVar109->vertex_count << 4;
          uStack_578 = 0;
          rVar30.proc_name = "rf_load_model_from_iqm";
          rVar30.file_name =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          rVar30.line_in_file = 0x8391;
          auVar89._8_8_ = (ulong)uStack_574 << 0x20;
          auVar89._0_8_ = lStack_580;
          auVar89._16_8_ = 0;
          pfVar110 = (float *)(*rStack_a38.allocator_proc)
                                        (&rStack_a38,rVar30,RF_AM_ALLOC,
                                         (rf_allocator_args)(auVar89 << 0x40));
          prVar109->bone_weights = pfVar110;
          memset(pfVar110,0,(long)prVar109->vertex_count << 4);
          iVar15 = *(int *)((long)__dest + sVar114 + 0x14);
          prVar109->triangle_count = iVar15;
          pcStack_5a0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          pcStack_598 = "rf_load_model_from_iqm";
          uStack_590 = 0x8396;
          uStack_5b8 = 0;
          lStack_5b0 = (long)iVar15 * 6;
          uStack_5a8 = 0;
          rVar31.proc_name = "rf_load_model_from_iqm";
          rVar31.file_name =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          rVar31.line_in_file = 0x8396;
          auVar90._8_8_ = (ulong)uStack_5a4 << 0x20;
          auVar90._0_8_ = lStack_5b0;
          auVar90._16_8_ = 0;
          puVar112 = (unsigned_short *)
                     (*rStack_a38.allocator_proc)
                               (&rStack_a38,rVar31,RF_AM_ALLOC,(rf_allocator_args)(auVar90 << 0x40))
          ;
          prVar109->indices = puVar112;
          memset(puVar112,0,(long)prVar109->triangle_count * 6);
          pcStack_5d0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          pcStack_5c8 = "rf_load_model_from_iqm";
          uStack_5c0 = 0x839b;
          uStack_5e8 = 0;
          lStack_5e0 = (long)prVar109->vertex_count * 0xc;
          uStack_5d8 = 0;
          rVar32.proc_name = "rf_load_model_from_iqm";
          rVar32.file_name =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          rVar32.line_in_file = 0x839b;
          auVar91._8_8_ = (ulong)uStack_5d4 << 0x20;
          auVar91._0_8_ = lStack_5e0;
          auVar91._16_8_ = 0;
          pfVar110 = (float *)(*rStack_a38.allocator_proc)
                                        (&rStack_a38,rVar32,RF_AM_ALLOC,
                                         (rf_allocator_args)(auVar91 << 0x40));
          prVar109->anim_vertices = pfVar110;
          memset(pfVar110,0,(long)prVar109->vertex_count * 0xc);
          pcStack_600 = 
          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          pcStack_5f8 = "rf_load_model_from_iqm";
          uStack_5f0 = 0x839e;
          uStack_618 = 0;
          lStack_610 = (long)prVar109->vertex_count * 0xc;
          uStack_608 = 0;
          rVar33.proc_name = "rf_load_model_from_iqm";
          rVar33.file_name =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          rVar33.line_in_file = 0x839e;
          auVar92._8_8_ = (ulong)uStack_604 << 0x20;
          auVar92._0_8_ = lStack_610;
          auVar92._16_8_ = 0;
          pfVar110 = (float *)(*rStack_a38.allocator_proc)
                                        (&rStack_a38,rVar33,RF_AM_ALLOC,
                                         (rf_allocator_args)(auVar92 << 0x40));
          prVar109->anim_normals = pfVar110;
          memset(pfVar110,0,(long)prVar109->vertex_count * 0xc);
          pcStack_630 = 
          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          pcStack_628 = "rf_load_model_from_iqm";
          uStack_620 = 0x83a1;
          uStack_648 = 0;
          uStack_640 = 0x1c;
          uStack_638 = 0;
          rVar34.proc_name = "rf_load_model_from_iqm";
          rVar34.file_name =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          rVar34.line_in_file = 0x83a1;
          rVar58._16_8_ = (ulong)uStack_634 << 0x20;
          rVar58.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x1c) << 0x40,0);
          rVar58.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x1c) << 0x40,8);
          puVar113 = (uint *)(*rStack_a38.allocator_proc)(&rStack_a38,rVar34,RF_AM_ALLOC,rVar58);
          prVar109->vbo_id = puVar113;
          puVar113[0] = 0;
          puVar113[1] = 0;
          puVar113[2] = 0;
          puVar113[3] = 0;
          puVar113[3] = 0;
          puVar113[4] = 0;
          puVar113[5] = 0;
          puVar113[6] = 0;
          sVar114 = sVar114 + 0x18;
          prVar109 = prVar109 + 1;
        } while (sVar1 != sVar114);
      }
      pcStack_660 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_658 = "rf_load_model_from_iqm";
      uStack_650 = 0x83a6;
      uStack_678 = 0;
      sVar1 = (ulong)uStack_2c4 * 0xc;
      uStack_668 = 0;
      rVar35.proc_name = "rf_load_model_from_iqm";
      rVar35.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar35.line_in_file = 0x83a6;
      auVar93._8_8_ = (ulong)uStack_664 << 0x20;
      auVar93._0_8_ = sVar1;
      auVar93._16_8_ = 0;
      sStack_670 = sVar1;
      pvVar115 = (*prVar133)((rf_allocator *)&stack0xfffffffffffff5b0,rVar35,RF_AM_ALLOC,
                             (rf_allocator_args)(auVar93 << 0x40));
      memcpy(pvVar115,(void *)((ulong)uStack_2c0 + (long)puVar107),sVar1);
      if (uStack_a18 != 0) {
        uVar116 = 0;
        do {
          uVar16 = *(uint *)((long)__dest + uVar116 * 0x18 + 0x10);
          uVar123 = (ulong)uVar16;
          uVar121 = *(int *)((long)__dest + uVar116 * 0x18 + 0x14) + uVar16;
          if (uVar16 < uVar121) {
            uVar17 = *(undefined4 *)((long)__dest + uVar116 * 0x18 + 8);
            puVar112 = prStack_a20[uVar116].indices;
            lVar122 = uVar121 - uVar123;
            lVar132 = 4;
            do {
              sVar20 = (short)uVar17;
              *(short *)((long)puVar112 + lVar132) =
                   (short)*(undefined4 *)((long)pvVar115 + lVar132 * 2 + uVar123 * 0xc + -8) -
                   sVar20;
              *(short *)((long)puVar112 + lVar132 + -2) =
                   (short)*(undefined4 *)((long)pvVar115 + lVar132 * 2 + uVar123 * 0xc + -4) -
                   sVar20;
              *(short *)((long)puVar112 + lVar132 + -4) =
                   (short)*(undefined4 *)((long)pvVar115 + lVar132 * 2 + uVar123 * 0xc) - sVar20;
              lVar132 = lVar132 + 6;
              lVar122 = lVar122 + -1;
            } while (lVar122 != 0);
          }
          uVar116 = uVar116 + 1;
        } while (uVar116 != uStack_a18);
      }
      pcStack_690 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_688 = "rf_load_model_from_iqm";
      uStack_680 = 0x83b8;
      uStack_6a8 = 0;
      uVar116 = (ulong)uStack_2d0;
      sVar1 = uVar116 * 0x14;
      uStack_698 = 0;
      rVar36.proc_name = "rf_load_model_from_iqm";
      rVar36.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar36.line_in_file = 0x83b8;
      auVar94._8_8_ = (ulong)uStack_694 << 0x20;
      auVar94._0_8_ = sVar1;
      auVar94._16_8_ = 0;
      pvStack_9f8 = pvVar115;
      sStack_6a0 = sVar1;
      pvVar115 = (*prVar133)((rf_allocator *)&stack0xfffffffffffff5b0,rVar36,RF_AM_ALLOC,
                             (rf_allocator_args)(auVar94 << 0x40));
      memcpy(pvVar115,(void *)((ulong)uStack_2c8 + (long)puVar107),sVar1);
      prVar109 = prStack_a20;
      if (uVar116 == 0) {
        __dest_03 = (void *)0x0;
        __dest_02 = (void *)0x0;
        prVar117 = (rf_allocator_proc *)0x0;
        __dest_01 = (void *)0x0;
        __dest_00 = (void *)0x0;
        prStack_a10 = (rf_bone_info *)uVar116;
      }
      else {
        uVar126 = (ulong)uStack_2d8;
        uVar123 = CONCAT44(0,iStack_2cc * 4);
        sStack_a08 = (ulong)(uint)(iStack_2cc * 2) << 2;
        sStack_a28 = (ulong)(uint)(iStack_2cc * 3) << 2;
        __dest_00 = (void *)0x0;
        __dest_01 = (void *)0x0;
        prVar117 = (rf_allocator_proc *)0x0;
        __dest_02 = (void *)0x0;
        __dest_03 = (void *)0x0;
        uVar127 = 0;
        prStack_a10 = (rf_bone_info *)uVar116;
        do {
          switch(*(undefined4 *)((long)pvVar115 + uVar127 * 0x14)) {
          case 0:
            pcStack_6c0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            pcStack_6b8 = "rf_load_model_from_iqm";
            uStack_6b0 = 0x83c1;
            uStack_6d8 = 0;
            sStack_6d0 = sStack_a28;
            uStack_6c8 = 0;
            rVar37.proc_name = "rf_load_model_from_iqm";
            rVar37.file_name =
                 "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            rVar37.line_in_file = 0x83c1;
            auVar95._8_8_ = (ulong)uStack_6c4 << 0x20;
            auVar95._0_8_ = sStack_a28;
            auVar95._16_8_ = 0;
            __dest_00 = (*prVar133)((rf_allocator *)&stack0xfffffffffffff5b0,rVar37,RF_AM_ALLOC,
                                    (rf_allocator_args)(auVar95 << 0x40));
            memcpy(__dest_00,
                   (void *)((ulong)*(uint *)((long)pvVar115 + uVar127 * 0x14 + 0x10) +
                           (long)puVar107),sStack_a28);
            if (uVar126 != 0) {
              uVar116 = 0;
              do {
                iVar15 = *(int *)((long)__dest + uVar116 * 0x18 + 8);
                uVar16 = iVar15 * 3;
                uVar121 = (iVar15 + *(int *)((long)__dest + uVar116 * 0x18 + 0xc)) * 3;
                if (uVar16 < uVar121) {
                  uVar125 = (ulong)uVar16;
                  pfVar110 = prVar109[uVar116].vertices;
                  pfVar18 = prVar109[uVar116].anim_vertices;
                  lVar122 = 0;
                  do {
                    pfVar110[lVar122] = *(float *)((long)__dest_00 + lVar122 * 4 + uVar125 * 4);
                    pfVar18[lVar122] = *(float *)((long)__dest_00 + lVar122 * 4 + uVar125 * 4);
                    lVar122 = lVar122 + 1;
                  } while (uVar121 - uVar125 != lVar122);
                }
                uVar116 = uVar116 + 1;
              } while (uVar116 != uVar126);
            }
            break;
          case 1:
            pcStack_720 = 
            "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            pcStack_718 = "rf_load_model_from_iqm";
            uStack_710 = 0x83e3;
            uStack_738 = 0;
            sStack_730 = sStack_a08;
            uStack_728 = 0;
            rVar39.proc_name = "rf_load_model_from_iqm";
            rVar39.file_name =
                 "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            rVar39.line_in_file = 0x83e3;
            auVar97._8_8_ = (ulong)uStack_724 << 0x20;
            auVar97._0_8_ = sStack_a08;
            auVar97._16_8_ = 0;
            prVar117 = (rf_allocator_proc *)
                       (*prVar133)((rf_allocator *)&stack0xfffffffffffff5b0,rVar39,RF_AM_ALLOC,
                                   (rf_allocator_args)(auVar97 << 0x40));
            memcpy(prVar117,(void *)((ulong)*(uint *)((long)pvVar115 + uVar127 * 0x14 + 0x10) +
                                    (long)puVar107),sStack_a08);
            if (uVar126 != 0) {
              uVar116 = 0;
              do {
                iVar15 = *(int *)((long)__dest + uVar116 * 0x18 + 8);
                uVar16 = iVar15 * 2;
                uVar121 = (iVar15 + *(int *)((long)__dest + uVar116 * 0x18 + 0xc)) * 2;
                if (uVar16 < uVar121) {
                  pfVar110 = prVar109[uVar116].texcoords;
                  lVar122 = 0;
                  do {
                    pfVar110[lVar122] = *(float *)(prVar117 + lVar122 * 4 + (ulong)uVar16 * 4);
                    lVar122 = lVar122 + 1;
                  } while ((ulong)uVar121 - (ulong)uVar16 != lVar122);
                }
                uVar116 = uVar116 + 1;
              } while (uVar116 != uVar126);
            }
            break;
          case 2:
            pcStack_6f0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            pcStack_6e8 = "rf_load_model_from_iqm";
            uStack_6e0 = 0x83d2;
            uStack_708 = 0;
            sStack_700 = sStack_a28;
            uStack_6f8 = 0;
            rVar38.proc_name = "rf_load_model_from_iqm";
            rVar38.file_name =
                 "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            rVar38.line_in_file = 0x83d2;
            auVar96._8_8_ = (ulong)uStack_6f4 << 0x20;
            auVar96._0_8_ = sStack_a28;
            auVar96._16_8_ = 0;
            __dest_01 = (*prVar133)((rf_allocator *)&stack0xfffffffffffff5b0,rVar38,RF_AM_ALLOC,
                                    (rf_allocator_args)(auVar96 << 0x40));
            memcpy(__dest_01,
                   (void *)((ulong)*(uint *)((long)pvVar115 + uVar127 * 0x14 + 0x10) +
                           (long)puVar107),sStack_a28);
            if (uVar126 != 0) {
              uVar116 = 0;
              do {
                iVar15 = *(int *)((long)__dest + uVar116 * 0x18 + 8);
                uVar16 = iVar15 * 3;
                uVar121 = (iVar15 + *(int *)((long)__dest + uVar116 * 0x18 + 0xc)) * 3;
                if (uVar16 < uVar121) {
                  uVar125 = (ulong)uVar16;
                  pfVar110 = prVar109[uVar116].normals;
                  pfVar18 = prVar109[uVar116].anim_normals;
                  lVar122 = 0;
                  do {
                    pfVar110[lVar122] = *(float *)((long)__dest_01 + lVar122 * 4 + uVar125 * 4);
                    pfVar18[lVar122] = *(float *)((long)__dest_01 + lVar122 * 4 + uVar125 * 4);
                    lVar122 = lVar122 + 1;
                  } while (uVar121 - uVar125 != lVar122);
                }
                uVar116 = uVar116 + 1;
              } while (uVar116 != uVar126);
            }
            break;
          case 4:
            pcStack_750 = 
            "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            pcStack_748 = "rf_load_model_from_iqm";
            uStack_740 = 0x83f3;
            uStack_768 = 0;
            uStack_758 = 0;
            rVar40.proc_name = "rf_load_model_from_iqm";
            rVar40.file_name =
                 "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            rVar40.line_in_file = 0x83f3;
            auVar98._8_8_ = (ulong)uStack_754 << 0x20;
            auVar98._0_8_ = uVar123;
            auVar98._16_8_ = 0;
            uStack_760 = uVar123;
            __dest_02 = (*prVar133)((rf_allocator *)&stack0xfffffffffffff5b0,rVar40,RF_AM_ALLOC,
                                    (rf_allocator_args)(auVar98 << 0x40));
            memcpy(__dest_02,
                   (void *)((ulong)*(uint *)((long)pvVar115 + uVar127 * 0x14 + 0x10) +
                           (long)puVar107),uVar123);
            if (uVar126 != 0) {
              uVar116 = 0;
              do {
                iVar15 = *(int *)((long)__dest + uVar116 * 0x18 + 8);
                uVar16 = iVar15 * 4;
                if (uVar16 < (uint)((iVar15 + *(int *)((long)__dest + uVar116 * 0x18 + 0xc)) * 4)) {
                  uVar125 = (ulong)uVar16;
                  piVar111 = prVar109[uVar116].bone_ids;
                  do {
                    *piVar111 = (int)*(char *)((long)__dest_02 + uVar125);
                    uVar125 = uVar125 + 1;
                    piVar111 = piVar111 + 1;
                  } while (uVar125 < (uint)((*(int *)((long)__dest + uVar116 * 0x18 + 0xc) +
                                            *(int *)((long)__dest + uVar116 * 0x18 + 8)) * 4));
                }
                uVar116 = uVar116 + 1;
              } while (uVar116 != uVar126);
            }
            break;
          case 5:
            pcStack_780 = 
            "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            pcStack_778 = "rf_load_model_from_iqm";
            uStack_770 = 0x8403;
            uStack_798 = 0;
            uStack_788 = 0;
            rVar41.proc_name = "rf_load_model_from_iqm";
            rVar41.file_name =
                 "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            rVar41.line_in_file = 0x8403;
            auVar99._8_8_ = (ulong)uStack_784 << 0x20;
            auVar99._0_8_ = uVar123;
            auVar99._16_8_ = 0;
            uStack_790 = uVar123;
            __dest_03 = (*prVar133)((rf_allocator *)&stack0xfffffffffffff5b0,rVar41,RF_AM_ALLOC,
                                    (rf_allocator_args)(auVar99 << 0x40));
            memcpy(__dest_03,
                   (void *)((ulong)*(uint *)((long)pvVar115 + uVar127 * 0x14 + 0x10) +
                           (long)puVar107),uVar123);
            if (uVar126 != 0) {
              uVar116 = 0;
              do {
                iVar15 = *(int *)((long)__dest + uVar116 * 0x18 + 8);
                uVar16 = iVar15 * 4;
                uVar121 = (iVar15 + *(int *)((long)__dest + uVar116 * 0x18 + 0xc)) * 4;
                if (uVar16 < uVar121) {
                  pfVar110 = prVar109[uVar116].bone_weights;
                  lVar122 = 0;
                  do {
                    pfVar110[lVar122] =
                         (float)*(byte *)((long)__dest_03 + lVar122 + (ulong)uVar16) / 255.0;
                    lVar122 = lVar122 + 1;
                  } while ((ulong)uVar121 - (ulong)uVar16 != lVar122);
                }
                uVar116 = uVar116 + 1;
              } while (uVar116 != uVar126);
            }
          }
          uVar127 = uVar127 + 1;
        } while ((rf_bone_info *)uVar127 != prStack_a10);
      }
      pcStack_7b0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_7a8 = "rf_load_model_from_iqm";
      uStack_7a0 = 0x8414;
      uStack_7c8 = 0;
      uVar116 = (ulong)uStack_2b8;
      sVar1 = uVar116 * 0x30;
      uStack_7b8 = 0;
      rVar42.proc_name = "rf_load_model_from_iqm";
      rVar42.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar42.line_in_file = 0x8414;
      auVar100._8_8_ = (ulong)uStack_7b4 << 0x20;
      auVar100._0_8_ = sVar1;
      auVar100._16_8_ = 0;
      prVar105 = prVar117;
      sStack_7c0 = sVar1;
      __dest_04 = (*prVar133)((rf_allocator *)&stack0xfffffffffffff5b0,rVar42,RF_AM_ALLOC,
                              (rf_allocator_args)(auVar100 << 0x40));
      memcpy(__dest_04,(void *)((ulong)uStack_2b4 + (long)puVar107),sVar1);
      pcStack_7e0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_7d8 = "rf_load_model_from_iqm";
      uStack_7d0 = 0x8418;
      puVar124 = (undefined4 *)0x0;
      uStack_7f8 = 0;
      lVar122 = uVar116 * 0x28;
      uStack_7e8 = 0;
      rVar43.proc_name = "rf_load_model_from_iqm";
      rVar43.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar43.line_in_file = 0x8418;
      auVar101._8_8_ = (ulong)uStack_7e4 << 0x20;
      auVar101._0_8_ = lVar122;
      auVar101._16_8_ = 0;
      lStack_7f0 = lVar122;
      prVar118 = (rf_bone_info *)
                 (*rStack_a38.allocator_proc)
                           (&rStack_a38,rVar43,RF_AM_ALLOC,(rf_allocator_args)(auVar101 << 0x40));
      pcStack_810 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_808 = "rf_load_model_from_iqm";
      uStack_800 = 0x8419;
      uStack_828 = 0;
      uStack_818 = 0;
      rVar44.proc_name = "rf_load_model_from_iqm";
      rVar44.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar44.line_in_file = 0x8419;
      auVar102._8_8_ = (ulong)uStack_814 << 0x20;
      auVar102._0_8_ = lVar122;
      auVar102._16_8_ = 0;
      lStack_820 = lVar122;
      prVar119 = (rf_transform *)
                 (*rStack_a38.allocator_proc)
                           (&rStack_a38,rVar44,RF_AM_ALLOC,(rf_allocator_args)(auVar102 << 0x40));
      sStack_a28 = uVar116;
      prStack_a10 = prVar118;
      if (uVar116 != 0) {
        puVar124 = (undefined4 *)((long)__dest_04 + 0x2c);
        lVar132 = 0;
        do {
          *(long *)(prVar118->name + lVar132 + 0x20) = (long)(int)puVar124[-10];
          puVar106 = (undefined8 *)
                     ((long)puVar107 + (ulong)(uint)puVar124[-0xb] + (ulong)uStack_2dc);
          uVar108 = *puVar106;
          uVar8 = puVar106[1];
          puVar106 = (undefined8 *)
                     ((long)puVar107 + (ulong)(uint)puVar124[-0xb] + (ulong)uStack_2dc + 0x10);
          uVar21 = puVar106[1];
          *(undefined8 *)(prVar118->name + lVar132 + 0x10) = *puVar106;
          *(undefined8 *)(prVar118->name + lVar132 + 0x10 + 8) = uVar21;
          *(undefined8 *)(prVar118->name + lVar132) = uVar108;
          *(undefined8 *)(prVar118->name + lVar132 + 8) = uVar8;
          *(undefined4 *)((long)&(prVar119->translation).x + lVar132) = puVar124[-9];
          *(undefined4 *)((long)&(prVar119->translation).y + lVar132) = puVar124[-8];
          *(undefined4 *)((long)&(prVar119->translation).z + lVar132) = puVar124[-7];
          *(undefined4 *)((long)&(prVar119->rotation).x + lVar132) = puVar124[-6];
          *(undefined4 *)((long)&(prVar119->rotation).y + lVar132) = puVar124[-5];
          *(undefined4 *)((long)&(prVar119->rotation).z + lVar132) = puVar124[-4];
          *(undefined4 *)((long)&(prVar119->rotation).w + lVar132) = puVar124[-3];
          *(undefined4 *)((long)&(prVar119->scale).x + lVar132) = puVar124[-2];
          *(undefined4 *)((long)&(prVar119->scale).y + lVar132) = puVar124[-1];
          *(undefined4 *)((long)&(prVar119->scale).z + lVar132) = *puVar124;
          lVar132 = lVar132 + 0x28;
          puVar124 = puVar124 + 0xc;
        } while (lVar122 != lVar132);
        lVar132 = 0;
        do {
          lVar19 = *(long *)(prVar118->name + lVar132 + 0x20);
          if (-1 < lVar19) {
            uVar2 = prVar119[lVar19].rotation.x;
            uVar9 = prVar119[lVar19].rotation.y;
            uVar3 = prVar119[lVar19].rotation.z;
            uVar10 = prVar119[lVar19].rotation.w;
            uVar108 = *(undefined8 *)((long)&(prVar119->rotation).x + lVar132);
            uVar8 = *(undefined8 *)((long)&(prVar119->rotation).z + lVar132);
            fVar136 = (float)uVar108;
            fVar137 = (float)((ulong)uVar108 >> 0x20);
            fVar138 = (float)uVar8;
            fVar139 = (float)((ulong)uVar8 >> 0x20);
            *(ulong *)((long)&(prVar119->rotation).x + lVar132) =
                 CONCAT44(((float)uVar3 * fVar136 + (float)uVar9 * fVar139 + (float)uVar10 * fVar137
                          ) - (float)uVar2 * fVar138,
                          ((float)uVar9 * fVar138 + (float)uVar2 * fVar139 + (float)uVar10 * fVar136
                          ) - (float)uVar3 * fVar137);
            *(ulong *)((long)&(prVar119->rotation).z + lVar132) =
                 CONCAT44(((fVar139 * (float)uVar10 - fVar136 * (float)uVar2) -
                          fVar137 * (float)uVar9) - (float)uVar3 * fVar138,
                          ((float)uVar2 * fVar137 + (float)uVar3 * fVar139 + (float)uVar10 * fVar138
                          ) - (float)uVar9 * fVar136);
            uVar4 = prVar119[*(long *)(prVar118->name + lVar132 + 0x20)].rotation.x;
            uVar11 = prVar119[*(long *)(prVar118->name + lVar132 + 0x20)].rotation.y;
            q.y = (float)uVar11;
            q.x = (float)uVar4;
            uVar5 = prVar119[*(long *)(prVar118->name + lVar132 + 0x20)].rotation.z;
            uVar12 = prVar119[*(long *)(prVar118->name + lVar132 + 0x20)].rotation.w;
            q.w = (float)uVar12;
            q.z = (float)uVar5;
            rVar140.z = *(float *)((long)&(prVar119->translation).z + lVar132);
            rVar140._0_8_ = *(undefined8 *)((long)&(prVar119->translation).x + lVar132);
            rVar140 = rf_vec3_rotate_by_quaternion(rVar140,q);
            *(long *)((long)&(prVar119->translation).x + lVar132) = rVar140._0_8_;
            *(float *)((long)&(prVar119->translation).z + lVar132) = rVar140.z;
            uVar6 = prVar119[*(long *)(prVar118->name + lVar132 + 0x20)].translation.x;
            uVar13 = prVar119[*(long *)(prVar118->name + lVar132 + 0x20)].translation.y;
            fVar136 = prVar119[*(long *)(prVar118->name + lVar132 + 0x20)].translation.z;
            *(ulong *)((long)&(prVar119->translation).x + lVar132) =
                 CONCAT44((float)uVar13 + rVar140.y,(float)uVar6 + rVar140.x);
            *(float *)((long)&(prVar119->translation).z + lVar132) = rVar140.z + fVar136;
            uVar108 = *(undefined8 *)((long)&(prVar119->scale).x + lVar132);
            uVar7 = prVar119[*(long *)(prVar118->name + lVar132 + 0x20)].scale.x;
            uVar14 = prVar119[*(long *)(prVar118->name + lVar132 + 0x20)].scale.y;
            fVar136 = prVar119[*(long *)(prVar118->name + lVar132 + 0x20)].scale.z;
            *(ulong *)((long)&(prVar119->scale).x + lVar132) =
                 CONCAT44((float)uVar14 * (float)((ulong)uVar108 >> 0x20),
                          (float)uVar7 * (float)uVar108);
            *(float *)((long)&(prVar119->scale).z + lVar132) =
                 *(float *)((long)&(prVar119->scale).z + lVar132) * fVar136;
          }
          lVar132 = lVar132 + 0x28;
        } while (lVar122 != lVar132);
      }
      pcStack_840 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_838 = "rf_load_model_from_iqm";
      uStack_830 = 0x843c;
      uStack_850 = 0;
      uStack_848 = 0;
      rVar45.proc_name = "rf_load_model_from_iqm";
      rVar45.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar45.line_in_file = 0x843c;
      rVar59.size_to_allocate_or_reallocate = 0;
      rVar59.pointer_to_free_or_realloc = __dest;
      rVar59._16_8_ = (ulong)uStack_844 << 0x20;
      pvStack_858 = __dest;
      (*prVar133)((rf_allocator *)&stack0xfffffffffffff5b0,rVar45,RF_AM_FREE,rVar59);
      pcStack_870 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_868 = "rf_load_model_from_iqm";
      uStack_860 = 0x843d;
      pvStack_888 = pvStack_9f8;
      uStack_880 = 0;
      uStack_878 = 0;
      rVar46.proc_name = "rf_load_model_from_iqm";
      rVar46.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar46.line_in_file = 0x843d;
      rVar60.size_to_allocate_or_reallocate = 0;
      rVar60.pointer_to_free_or_realloc = pvStack_9f8;
      rVar60._16_8_ = (ulong)uStack_874 << 0x20;
      (*prVar133)((rf_allocator *)&stack0xfffffffffffff5b0,rVar46,RF_AM_FREE,rVar60);
      pcStack_8a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_898 = "rf_load_model_from_iqm";
      uStack_890 = 0x843e;
      uStack_8b0 = 0;
      uStack_8a8 = 0;
      rVar47.proc_name = "rf_load_model_from_iqm";
      rVar47.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar47.line_in_file = 0x843e;
      rVar61.size_to_allocate_or_reallocate = 0;
      rVar61.pointer_to_free_or_realloc = pvVar115;
      rVar61._16_8_ = (ulong)uStack_8a4 << 0x20;
      pvStack_8b8 = pvVar115;
      (*prVar133)((rf_allocator *)&stack0xfffffffffffff5b0,rVar47,RF_AM_FREE,rVar61);
      pcStack_8d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_8c8 = "rf_load_model_from_iqm";
      uStack_8c0 = 0x843f;
      uStack_8e0 = 0;
      uStack_8d8 = 0;
      rVar48.proc_name = "rf_load_model_from_iqm";
      rVar48.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar48.line_in_file = 0x843f;
      rVar62.size_to_allocate_or_reallocate = 0;
      rVar62.pointer_to_free_or_realloc = __dest_00;
      rVar62._16_8_ = (ulong)uStack_8d4 << 0x20;
      pvStack_8e8 = __dest_00;
      (*prVar133)((rf_allocator *)&stack0xfffffffffffff5b0,rVar48,RF_AM_FREE,rVar62);
      pcStack_900 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_8f8 = "rf_load_model_from_iqm";
      uStack_8f0 = 0x8440;
      uStack_910 = 0;
      uStack_908 = 0;
      rVar49.proc_name = "rf_load_model_from_iqm";
      rVar49.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar49.line_in_file = 0x8440;
      rVar63.size_to_allocate_or_reallocate = 0;
      rVar63.pointer_to_free_or_realloc = __dest_01;
      rVar63._16_8_ = (ulong)uStack_904 << 0x20;
      pvStack_918 = __dest_01;
      (*prVar133)((rf_allocator *)&stack0xfffffffffffff5b0,rVar49,RF_AM_FREE,rVar63);
      pcStack_930 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_928 = "rf_load_model_from_iqm";
      uStack_920 = 0x8441;
      uStack_940 = 0;
      uStack_938 = 0;
      rVar50.proc_name = "rf_load_model_from_iqm";
      rVar50.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar50.line_in_file = 0x8441;
      rVar64.size_to_allocate_or_reallocate = 0;
      rVar64.pointer_to_free_or_realloc = prVar117;
      rVar64._16_8_ = (ulong)uStack_934 << 0x20;
      prStack_948 = prVar117;
      (*prVar133)((rf_allocator *)&stack0xfffffffffffff5b0,rVar50,RF_AM_FREE,rVar64);
      pcStack_960 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_958 = "rf_load_model_from_iqm";
      uStack_950 = 0x8442;
      uStack_970 = 0;
      uStack_968 = 0;
      rVar51.proc_name = "rf_load_model_from_iqm";
      rVar51.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar51.line_in_file = 0x8442;
      rVar65.size_to_allocate_or_reallocate = 0;
      rVar65.pointer_to_free_or_realloc = __dest_02;
      rVar65._16_8_ = (ulong)uStack_964 << 0x20;
      pvStack_978 = __dest_02;
      (*prVar133)((rf_allocator *)&stack0xfffffffffffff5b0,rVar51,RF_AM_FREE,rVar65);
      pcStack_990 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_988 = "rf_load_model_from_iqm";
      uStack_980 = 0x8443;
      uStack_9a0 = 0;
      uStack_998 = 0;
      rVar52.proc_name = "rf_load_model_from_iqm";
      rVar52.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar52.line_in_file = 0x8443;
      rVar66.size_to_allocate_or_reallocate = 0;
      rVar66.pointer_to_free_or_realloc = __dest_03;
      rVar66._16_8_ = (ulong)uStack_994 << 0x20;
      pvStack_9a8 = __dest_03;
      (*prVar133)((rf_allocator *)&stack0xfffffffffffff5b0,rVar52,RF_AM_FREE,rVar66);
      pcStack_9c0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_9b8 = "rf_load_model_from_iqm";
      uStack_9b0 = 0x8444;
      uStack_9d0 = 0;
      uStack_9c8 = 0;
      rVar53.proc_name = "rf_load_model_from_iqm";
      rVar53.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar53.line_in_file = 0x8444;
      rVar67.size_to_allocate_or_reallocate = 0;
      rVar67.pointer_to_free_or_realloc = __dest_04;
      rVar67._16_8_ = (ulong)uStack_9c4 << 0x20;
      pvStack_9d8 = __dest_04;
      (*prVar133)((rf_allocator *)&stack0xfffffffffffff5b0,rVar53,RF_AM_FREE,rVar67);
      lVar122 = lStack_a00;
      prVar109 = prStack_a20;
      rStack_9e8.user_data = rStack_a38.user_data;
      rStack_9e8.allocator_proc = rStack_a38.allocator_proc;
      if (uStack_a18 == 0) {
        pcStack_318 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_310 = "rf_load_meshes_and_materials_for_model";
        uStack_308 = 0x8160;
        rf_log_impl(4,0x17f484);
        pcStack_378 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_370 = "rf_load_meshes_and_materials_for_model";
        uStack_368 = 0x8163;
        uStack_390 = 0;
        uStack_388 = 0x70;
        uStack_380 = 0;
        rVar54.proc_name = "rf_load_meshes_and_materials_for_model";
        rVar54.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        rVar54.line_in_file = 0x8163;
        rVar68._16_8_ = (ulong)uStack_37c << 0x20;
        rVar68.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x70) << 0x40,0);
        rVar68.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x70) << 0x40,8);
        prVar120 = (rf_mesh *)(*rStack_9e8.allocator_proc)(&rStack_9e8,rVar54,RF_AM_ALLOC,rVar68);
        prVar120->vertex_count = 0;
        prVar120->triangle_count = 0;
        prVar120->vertices = (float *)0x0;
        prVar120->texcoords = (float *)0x0;
        prVar120->texcoords2 = (float *)0x0;
        prVar120->normals = (float *)0x0;
        prVar120->tangents = (float *)0x0;
        prVar120->colors = (uchar *)0x0;
        prVar120->indices = (unsigned_short *)0x0;
        prVar120->anim_vertices = (float *)0x0;
        prVar120->anim_normals = (float *)0x0;
        prVar120->bone_ids = (int *)0x0;
        prVar120->bone_weights = (float *)0x0;
        *(undefined8 *)&prVar120->vao_id = 0;
        prVar120->vbo_id = (uint *)0x0;
        allocator_01.allocator_proc = rStack_9e8.allocator_proc;
        allocator_01.user_data = rStack_9e8.user_data;
        temp_allocator_00.allocator_proc = prVar105;
        temp_allocator_00.user_data = puVar124;
        rf_gen_mesh_cube(&rStack_280,1.0,1.0,1.0,allocator_01,temp_allocator_00);
        prVar109 = &rStack_280;
        prVar130 = prVar120;
        for (lVar122 = 0xe; lVar122 != 0; lVar122 = lVar122 + -1) {
          iVar15 = prVar109->triangle_count;
          prVar130->vertex_count = prVar109->vertex_count;
          prVar130->triangle_count = iVar15;
          prVar109 = (rf_mesh *)((long)prVar109 + (ulong)bVar134 * -0x10 + 8);
          prVar130 = (rf_mesh *)((long)prVar130 + (ulong)bVar134 * -0x10 + 8);
        }
        uStack_a18 = 1;
        prStack_a20 = prVar120;
      }
      else {
        lVar132 = 0;
        do {
          rf_gfx_load_mesh((rf_mesh *)((long)&prVar109->vertex_count + lVar132),false);
          lVar132 = lVar132 + 0x70;
        } while (lVar122 != lVar132);
      }
      pcStack_330 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_328 = "rf_load_meshes_and_materials_for_model";
      uStack_320 = 0x8170;
      rf_log_impl(4,0x17f4b3);
      pcStack_3a8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_3a0 = "rf_load_meshes_and_materials_for_model";
      uStack_398 = 0x8173;
      uStack_3c0 = 0;
      uStack_3b8 = 0x98;
      uStack_3b0 = 0;
      rVar55.proc_name = "rf_load_meshes_and_materials_for_model";
      rVar55.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar55.line_in_file = 0x8173;
      rVar69._16_8_ = (ulong)uStack_3ac << 0x20;
      rVar69.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x98) << 0x40,0);
      rVar69.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x98) << 0x40,8);
      __s = (rf_material *)(*rStack_9e8.allocator_proc)(&rStack_9e8,rVar55,RF_AM_ALLOC,rVar69);
      memset(__s,0,0x98);
      allocator_00.allocator_proc = prVar131;
      allocator_00.user_data = puVar107;
      rf_load_default_material(allocator_00);
      memcpy(__s,&rStack_280,0x98);
      uVar116 = uStack_a18;
      rStack_280._0_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rStack_280.vertices = (float *)0x17f45d;
      rStack_280.texcoords = (float *)0x8179;
      uStack_3d8 = 0;
      sVar1 = uStack_a18 * 4;
      uStack_3c8 = 0;
      rVar56.proc_name = "rf_load_meshes_and_materials_for_model";
      rVar56.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar56.line_in_file = 0x8179;
      auVar103._8_8_ = (ulong)uStack_3c4 << 0x20;
      auVar103._0_8_ = sVar1;
      auVar103._16_8_ = 0;
      sStack_3d0 = sVar1;
      piVar111 = (int *)(*rStack_9e8.allocator_proc)
                                  (&rStack_9e8,rVar56,RF_AM_ALLOC,
                                   (rf_allocator_args)(auVar103 << 0x40));
      memset(piVar111,0,sVar1);
      (prStack_9f0->transform).m0 = 1.0;
      (prStack_9f0->transform).m4 = 0.0;
      (prStack_9f0->transform).m8 = 0.0;
      (prStack_9f0->transform).m12 = 0.0;
      (prStack_9f0->transform).m1 = 0.0;
      (prStack_9f0->transform).m5 = 1.0;
      (prStack_9f0->transform).m9 = 0.0;
      (prStack_9f0->transform).m13 = 0.0;
      (prStack_9f0->transform).m2 = 0.0;
      (prStack_9f0->transform).m6 = 0.0;
      (prStack_9f0->transform).m10 = 1.0;
      (prStack_9f0->transform).m14 = 0.0;
      (prStack_9f0->transform).m3 = 0.0;
      (prStack_9f0->transform).m7 = 0.0;
      (prStack_9f0->transform).m11 = 0.0;
      (prStack_9f0->transform).m15 = 1.0;
      prStack_9f0->mesh_count = uVar116;
      prStack_9f0->meshes = prStack_a20;
      prStack_9f0->material_count = 1;
      prStack_9f0->materials = __s;
      prStack_9f0->mesh_material = piVar111;
      prStack_9f0->bone_count = sStack_a28;
      prStack_9f0->bones = prStack_a10;
      prStack_9f0->bind_pose = prVar119;
      return prStack_9f0;
    }
    pcStack_360 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_358 = "rf_load_model_from_iqm";
    uStack_350 = 0x8371;
    rf_log_impl(4,0x17d815,msg);
  }
  else {
    pcStack_348 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_340 = "rf_load_model_from_iqm";
    uStack_338 = 0x836b;
    rf_log_impl(4,0x17d7ed,msg);
  }
  prVar128->bones = (rf_bone_info *)0x0;
  prVar128->bind_pose = (rf_transform *)0x0;
  prVar128->mesh_material = (int *)0x0;
  prVar128->bone_count = 0;
  prVar128->material_count = 0;
  prVar128->materials = (rf_material *)0x0;
  prVar128->mesh_count = 0;
  prVar128->meshes = (rf_mesh *)0x0;
  (prVar128->transform).m3 = 0.0;
  (prVar128->transform).m7 = 0.0;
  (prVar128->transform).m11 = 0.0;
  (prVar128->transform).m15 = 0.0;
  (prVar128->transform).m2 = 0.0;
  (prVar128->transform).m6 = 0.0;
  (prVar128->transform).m10 = 0.0;
  (prVar128->transform).m14 = 0.0;
  (prVar128->transform).m1 = 0.0;
  (prVar128->transform).m5 = 0.0;
  (prVar128->transform).m9 = 0.0;
  (prVar128->transform).m13 = 0.0;
  *(void **)&prVar128->transform = (void *)0x0;
  *(rf_allocator_proc **)&(prVar128->transform).m8 = (rf_allocator_proc *)0x0;
  return prVar128;
}

Assistant:

RF_API rf_model rf_load_model_from_obj(const char* filename, rf_allocator allocator, rf_allocator temp_allocator, rf_io_callbacks io)
{
    rf_model model  = {0};
    allocator = allocator;

    tinyobj_attrib_t attrib     = {0};
    tinyobj_shape_t* meshes     = NULL;
    size_t           mesh_count = 0;

    tinyobj_material_t* materials      = NULL;
    size_t              material_count = 0;

    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(temp_allocator); // Set to NULL at the end of the function
    RF_SET_TINYOBJ_IO_CALLBACKS(io);
    {
        unsigned int flags = TINYOBJ_FLAG_TRIANGULATE;
        int ret            = tinyobj_parse_obj(&attrib, &meshes, (size_t*) &mesh_count, &materials, &material_count, filename, rf_tinyobj_file_reader_callback, flags);

        if (ret != TINYOBJ_SUCCESS)
        {
            RF_LOG(RF_LOG_TYPE_WARNING, "Model data could not be loaded. Filename %s", filename);
        }
        else
        {
            RF_LOG(RF_LOG_TYPE_INFO, "Model data loaded successfully: %i meshes / %i materials, filename: %s", mesh_count, material_count, filename);
        }

        // Init model meshes array
        {
            // TODO: Support multiple meshes... in the meantime, only one mesh is returned
            //model.mesh_count = mesh_count;
            model.mesh_count = 1;
            model.meshes     = (rf_mesh*) RF_ALLOC(allocator, model.mesh_count * sizeof(rf_mesh));
            memset(model.meshes, 0, model.mesh_count * sizeof(rf_mesh));
        }

        // Init model materials array
        if (material_count > 0)
        {
            model.material_count = material_count;
            model.materials      = (rf_material*) RF_ALLOC(allocator, model.material_count * sizeof(rf_material));
            memset(model.materials, 0, model.material_count * sizeof(rf_material));
        }

        model.mesh_material = (int*) RF_ALLOC(allocator, model.mesh_count * sizeof(int));
        memset(model.mesh_material, 0, model.mesh_count * sizeof(int));

        // Init model meshes
        for (rf_int m = 0; m < 1; m++)
        {
            rf_mesh mesh = (rf_mesh)
            {
                .vertex_count   = attrib.num_faces * 3,
                .triangle_count = attrib.num_faces,

                .vertices  = (float*)        RF_ALLOC(allocator, (attrib.num_faces * 3) * 3 * sizeof(float)),
                .texcoords = (float*)        RF_ALLOC(allocator, (attrib.num_faces * 3) * 2 * sizeof(float)),
                .normals   = (float*)        RF_ALLOC(allocator, (attrib.num_faces * 3) * 3 * sizeof(float)),
                .vbo_id    = (unsigned int*) RF_ALLOC(allocator, RF_MAX_MESH_VBO            * sizeof(unsigned int)),
            };

            memset(mesh.vertices,  0, mesh.vertex_count * 3 * sizeof(float));
            memset(mesh.texcoords, 0, mesh.vertex_count * 2 * sizeof(float));
            memset(mesh.normals,   0, mesh.vertex_count * 3 * sizeof(float));
            memset(mesh.vbo_id,    0, RF_MAX_MESH_VBO       * sizeof(unsigned int));

            int vCount  = 0;
            int vtCount = 0;
            int vnCount = 0;

            for (rf_int f = 0; f < attrib.num_faces; f++)
            {
                // Get indices for the face
                tinyobj_vertex_index_t idx0 = attrib.faces[3 * f + 0];
                tinyobj_vertex_index_t idx1 = attrib.faces[3 * f + 1];
                tinyobj_vertex_index_t idx2 = attrib.faces[3 * f + 2];

                // RF_LOG(RF_LOG_TYPE_DEBUG, "Face %i index: v %i/%i/%i . vt %i/%i/%i . vn %i/%i/%i\n", f, idx0.v_idx, idx1.v_idx, idx2.v_idx, idx0.vt_idx, idx1.vt_idx, idx2.vt_idx, idx0.vn_idx, idx1.vn_idx, idx2.vn_idx);

                // Fill vertices buffer (float) using vertex index of the face
                for (rf_int v = 0; v < 3; v++) { mesh.vertices[vCount + v] = attrib.vertices[idx0.v_idx * 3 + v]; }
                vCount +=3;

                for (rf_int v = 0; v < 3; v++) { mesh.vertices[vCount + v] = attrib.vertices[idx1.v_idx * 3 + v]; }
                vCount +=3;

                for (rf_int v = 0; v < 3; v++) { mesh.vertices[vCount + v] = attrib.vertices[idx2.v_idx * 3 + v]; }
                vCount +=3;

                // Fill texcoords buffer (float) using vertex index of the face
                // NOTE: Y-coordinate must be flipped upside-down
                mesh.texcoords[vtCount + 0] = attrib.texcoords[idx0.vt_idx * 2 + 0];
                mesh.texcoords[vtCount + 1] = 1.0f - attrib.texcoords[idx0.vt_idx * 2 + 1]; vtCount += 2;
                mesh.texcoords[vtCount + 0] = attrib.texcoords[idx1.vt_idx * 2 + 0];
                mesh.texcoords[vtCount + 1] = 1.0f - attrib.texcoords[idx1.vt_idx * 2 + 1]; vtCount += 2;
                mesh.texcoords[vtCount + 0] = attrib.texcoords[idx2.vt_idx * 2 + 0];
                mesh.texcoords[vtCount + 1] = 1.0f - attrib.texcoords[idx2.vt_idx * 2 + 1]; vtCount += 2;

                // Fill normals buffer (float) using vertex index of the face
                for (rf_int v = 0; v < 3; v++) { mesh.normals[vnCount + v] = attrib.normals[idx0.vn_idx * 3 + v]; }
                vnCount +=3;

                for (rf_int v = 0; v < 3; v++) { mesh.normals[vnCount + v] = attrib.normals[idx1.vn_idx * 3 + v]; }
                vnCount +=3;

                for (rf_int v = 0; v < 3; v++) { mesh.normals[vnCount + v] = attrib.normals[idx2.vn_idx * 3 + v]; }
                vnCount +=3;
            }

            model.meshes[m] = mesh; // Assign mesh data to model

            // Assign mesh material for current mesh
            model.mesh_material[m] = attrib.material_ids[m];

            // Set unfound materials to default
            if (model.mesh_material[m] == -1) { model.mesh_material[m] = 0; }
        }

        // Init model materials
        for (rf_int m = 0; m < material_count; m++)
        {
            // Init material to default
            // NOTE: Uses default shader, only RF_MAP_DIFFUSE supported
            model.materials[m] = rf_load_default_material(allocator);
            model.materials[m].maps[RF_MAP_DIFFUSE].texture = rf_get_default_texture(); // Get default texture, in case no texture is defined

            if (materials[m].diffuse_texname != NULL)
            {
                model.materials[m].maps[RF_MAP_DIFFUSE].texture = rf_load_texture_from_file(materials[m].diffuse_texname, temp_allocator, io); //char* diffuse_texname; // map_Kd
            }

            model.materials[m].maps[RF_MAP_DIFFUSE].color = (rf_color)
            {
                (float)(materials[m].diffuse[0] * 255.0f),
                (float)(materials[m].diffuse[1] * 255.0f),
                (float)(materials[m].diffuse[2] * 255.0f),
                255
            };

            model.materials[m].maps[RF_MAP_DIFFUSE].value = 0.0f;

            if (materials[m].specular_texname != NULL)
            {
                model.materials[m].maps[RF_MAP_SPECULAR].texture = rf_load_texture_from_file(materials[m].specular_texname, temp_allocator, io); //char* specular_texname; // map_Ks
            }

            model.materials[m].maps[RF_MAP_SPECULAR].color = (rf_color)
            {
                (float)(materials[m].specular[0] * 255.0f),
                (float)(materials[m].specular[1] * 255.0f),
                (float)(materials[m].specular[2] * 255.0f),
                255
            };

            model.materials[m].maps[RF_MAP_SPECULAR].value = 0.0f;

            if (materials[m].bump_texname != NULL)
            {
                model.materials[m].maps[RF_MAP_NORMAL].texture = rf_load_texture_from_file(materials[m].bump_texname, temp_allocator, io); //char* bump_texname; // map_bump, bump
            }

            model.materials[m].maps[RF_MAP_NORMAL].color = RF_WHITE;
            model.materials[m].maps[RF_MAP_NORMAL].value = materials[m].shininess;

            model.materials[m].maps[RF_MAP_EMISSION].color = (rf_color)
            {
                (float)(materials[m].emission[0] * 255.0f),
                (float)(materials[m].emission[1] * 255.0f),
                (float)(materials[m].emission[2] * 255.0f),
                255
            };

            if (materials[m].displacement_texname != NULL)
            {
                model.materials[m].maps[RF_MAP_HEIGHT].texture = rf_load_texture_from_file(materials[m].displacement_texname, temp_allocator, io); //char* displacement_texname; // disp
            }
        }

        tinyobj_attrib_free(&attrib);
        tinyobj_shapes_free(meshes, mesh_count);
        tinyobj_materials_free(materials, material_count);
    }
    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);
    RF_SET_TINYOBJ_IO_CALLBACKS(RF_NULL_IO);

    // NOTE: At this point we have all model data loaded
    RF_LOG(RF_LOG_TYPE_INFO, "Model loaded successfully in RAM. Filename: %s", filename);

    return rf_load_meshes_and_materials_for_model(model, allocator, temp_allocator);
}